

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O2

ElementsDecodeRawTransactionRequestStruct * __thiscall
cfd::api::json::ElementsDecodeRawTransactionRequest::ConvertToStruct
          (ElementsDecodeRawTransactionRequestStruct *__return_storage_ptr__,
          ElementsDecodeRawTransactionRequest *this)

{
  ElementsDecodeRawTransactionRequestStruct::ElementsDecodeRawTransactionRequestStruct
            (__return_storage_ptr__);
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->network);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->mainchain_network);
  __return_storage_ptr__->iswitness = this->iswitness_;
  __return_storage_ptr__->full_dump = this->full_dump_;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(__return_storage_ptr__->ignore_items)._M_t,&(this->ignore_items)._M_t);
  return __return_storage_ptr__;
}

Assistant:

ElementsDecodeRawTransactionRequestStruct ElementsDecodeRawTransactionRequest::ConvertToStruct() const {  // NOLINT
  ElementsDecodeRawTransactionRequestStruct result;
  result.hex = hex_;
  result.network = network_;
  result.mainchain_network = mainchain_network_;
  result.iswitness = iswitness_;
  result.full_dump = full_dump_;
  result.ignore_items = ignore_items;
  return result;
}